

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_blas2.c
# Opt level: O1

int sp_ctrsv(char *uplo,char *trans,char *diag,SuperMatrix *L,SuperMatrix *U,singlecomplex *x,
            SuperLUStat_t *stat,int *info)

{
  float fVar1;
  float fVar2;
  float fVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  singlecomplex *psVar15;
  long lVar16;
  SuperMatrix *pSVar17;
  singlecomplex *psVar18;
  void *pvVar19;
  void *pvVar20;
  long lVar21;
  SuperMatrix *pSVar22;
  int *piVar23;
  long lVar24;
  uint uVar25;
  long lVar26;
  int iVar27;
  int iVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  int nsupc;
  int nsupr;
  SuperMatrix *local_180;
  SuperMatrix *local_178;
  void *local_170;
  int incx;
  char *local_160;
  void *local_158;
  singlecomplex *local_150;
  long local_148;
  singlecomplex *local_140;
  singlecomplex temp;
  
  incx = 1;
  *info = 0;
  if ((*uplo == 'U') || (iVar27 = -1, *uplo == 'L')) {
    iVar27 = -2;
    if (((0x11 < (byte)*trans - 0x43) || ((0x20801U >> ((byte)*trans - 0x43 & 0x1f) & 1) == 0)) ||
       ((*diag != 'U' && (iVar27 = -3, *diag != 'N')))) goto LAB_0011195c;
    iVar27 = -4;
    if ((L->nrow < 0) || (L->nrow != L->ncol)) goto LAB_0011195c;
    iVar27 = -5;
    if ((U->nrow < 0) || (U->nrow != U->ncol)) goto LAB_0011195c;
  }
  else {
LAB_0011195c:
    *info = iVar27;
  }
  if (*info != 0) {
    temp.r = (float)-*info;
    input_error("sp_ctrsv",(int *)&temp);
    return 0;
  }
  local_170 = L->Store;
  lVar9 = *(long *)((long)local_170 + 8);
  pvVar19 = U->Store;
  lVar26 = *(long *)((long)pvVar19 + 8);
  local_180 = U;
  local_178 = L;
  local_150 = singlecomplexCalloc((long)L->nrow);
  if (local_150 == (singlecomplex *)0x0) {
    sprintf((char *)&temp,"%s at line %d in file %s\n","Malloc fails for work in sp_ctrsv().",0x81);
    superlu_abort_and_exit((char *)&temp);
  }
  cVar4 = *uplo;
  if (*trans == 'T') {
    if (cVar4 == 'L') {
      if (local_178->nrow == 0) {
        return 0;
      }
      if (-1 < (long)*(int *)((long)local_170 + 4)) {
        fVar31 = 0.0;
        lVar26 = (long)*(int *)((long)local_170 + 4);
        do {
          lVar12 = *(long *)((long)local_170 + 0x30);
          iVar27 = *(int *)(lVar12 + lVar26 * 4);
          lVar16 = (long)iVar27;
          iVar6 = *(int *)(*(long *)((long)local_170 + 0x20) + lVar16 * 4);
          nsupr = *(int *)(*(long *)((long)local_170 + 0x20) + 4 + lVar16 * 4) - iVar6;
          nsupc = *(int *)(lVar12 + 4 + lVar26 * 4) - iVar27;
          lVar13 = *(long *)((long)local_170 + 0x10);
          local_178 = (SuperMatrix *)(long)*(int *)(lVar13 + lVar16 * 4);
          iVar28 = *(int *)(lVar12 + 4 + lVar26 * 4);
          if (iVar27 < iVar28) {
            lVar12 = lVar16;
            do {
              lVar24 = (long)*(int *)(lVar13 + lVar12 * 4) + (long)nsupc;
              iVar27 = *(int *)(lVar13 + 4 + lVar12 * 4);
              if ((int)lVar24 < iVar27) {
                fVar29 = x[lVar12].r;
                fVar30 = x[lVar12].i;
                piVar23 = (int *)(*(long *)((long)local_170 + 0x18) + (long)(iVar6 + nsupc) * 4);
                do {
                  fVar1 = *(float *)(lVar9 + lVar24 * 8);
                  fVar2 = *(float *)(lVar9 + 4 + lVar24 * 8);
                  fVar29 = fVar29 - (x[*piVar23].r * fVar1 - fVar2 * x[*piVar23].i);
                  fVar30 = fVar30 - (x[*piVar23].i * fVar1 + x[*piVar23].r * fVar2);
                  x[lVar12].r = fVar29;
                  x[lVar12].i = fVar30;
                  lVar24 = lVar24 + 1;
                  piVar23 = piVar23 + 1;
                } while (lVar24 < iVar27);
              }
              lVar12 = lVar12 + 1;
            } while (lVar12 != iVar28);
          }
          fVar31 = fVar31 + (float)((nsupr - nsupc) * nsupc * 8);
          if (1 < nsupc) {
            local_180 = (SuperMatrix *)
                        CONCAT44(local_180._4_4_,fVar31 + (float)((nsupc + -1) * nsupc * 4));
            ctrsv_("L","T","U",&nsupc,(singlecomplex *)(lVar9 + (long)local_178 * 8),&nsupr,
                   x + lVar16,&incx);
            fVar31 = local_180._0_4_;
          }
          bVar11 = 0 < lVar26;
          lVar26 = lVar26 + -1;
        } while (bVar11);
        goto LAB_001124ef;
      }
    }
    else {
      if (local_180->nrow == 0) {
        return 0;
      }
      if (-1 < *(int *)((long)local_170 + 4)) {
        fVar31 = 0.0;
        lVar12 = 0;
        do {
          lVar13 = *(long *)((long)local_170 + 0x30);
          iVar27 = *(int *)(lVar13 + lVar12 * 4);
          lVar16 = (long)iVar27;
          nsupr = *(int *)(*(long *)((long)local_170 + 0x20) + 4 + lVar16 * 4) -
                  *(int *)(*(long *)((long)local_170 + 0x20) + lVar16 * 4);
          iVar28 = *(int *)(lVar13 + 4 + lVar12 * 4) - iVar27;
          local_178 = (SuperMatrix *)(long)*(int *)(*(long *)((long)local_170 + 0x10) + lVar16 * 4);
          iVar6 = *(int *)(lVar13 + 4 + lVar12 * 4);
          if (iVar27 < iVar6) {
            lVar13 = *(long *)((long)pvVar19 + 0x18);
            lVar24 = lVar16;
            do {
              iVar27 = *(int *)(lVar13 + 4 + lVar24 * 4);
              iVar7 = *(int *)(lVar13 + lVar24 * 4);
              lVar21 = (long)iVar7;
              if (iVar27 - iVar7 != 0 && iVar7 <= iVar27) {
                lVar10 = *(long *)((long)pvVar19 + 0x10);
                fVar29 = x[lVar24].r;
                fVar30 = x[lVar24].i;
                do {
                  iVar8 = *(int *)(lVar10 + lVar21 * 4);
                  fVar1 = *(float *)(lVar26 + lVar21 * 8);
                  fVar2 = *(float *)(lVar26 + 4 + lVar21 * 8);
                  fVar29 = fVar29 - (x[iVar8].r * fVar1 - fVar2 * x[iVar8].i);
                  fVar30 = fVar30 - (x[iVar8].i * fVar1 + x[iVar8].r * fVar2);
                  x[lVar24].r = fVar29;
                  x[lVar24].i = fVar30;
                  lVar21 = lVar21 + 1;
                } while (iVar27 != lVar21);
              }
              lVar24 = lVar24 + 1;
              fVar31 = fVar31 + (float)((iVar27 - iVar7) * 8);
            } while (lVar24 != iVar6);
          }
          local_180 = (SuperMatrix *)CONCAT44(local_180._4_4_,fVar31);
          psVar18 = x + lVar16;
          psVar15 = (singlecomplex *)((long)local_178 * 8 + lVar9);
          nsupc = iVar28;
          if (iVar28 == 1) {
            c_div(psVar18,psVar18,psVar15);
          }
          else {
            ctrsv_("U","T","N",&nsupc,psVar15,&nsupr,psVar18,&incx);
          }
          fVar31 = local_180._0_4_ + (float)((iVar28 * 4 + 0xe) * iVar28);
          bVar11 = lVar12 < *(int *)((long)local_170 + 4);
          lVar12 = lVar12 + 1;
        } while (bVar11);
        goto LAB_001124ef;
      }
    }
  }
  else if (*trans == 'N') {
    if (cVar4 == 'L') {
      if (local_178->nrow == 0) {
        return 0;
      }
      if (-1 < *(int *)((long)local_170 + 4)) {
        local_148 = lVar9 + 0xc;
        fVar30 = 0.0;
        fVar29 = 0.0;
        fVar31 = 0.0;
        pSVar17 = (SuperMatrix *)0x0;
        pvVar19 = local_170;
        do {
          lVar26 = *(long *)((long)pvVar19 + 0x20);
          iVar27 = *(int *)(*(long *)((long)pvVar19 + 0x30) + (long)pSVar17 * 4);
          lVar12 = (long)iVar27;
          uVar5 = *(uint *)(lVar26 + lVar12 * 4);
          nsupr = *(int *)(lVar26 + 4 + lVar12 * 4) - uVar5;
          iVar27 = *(int *)(*(long *)((long)pvVar19 + 0x30) + 4 + (long)pSVar17 * 4) - iVar27;
          iVar6 = *(int *)(*(long *)((long)pvVar19 + 0x10) + lVar12 * 4);
          uVar25 = nsupr - iVar27;
          nsupc = iVar27;
          if (iVar27 == 1) {
            iVar28 = *(int *)(lVar26 + 4 + lVar12 * 4);
            if ((int)((long)(int)uVar5 + 1) < iVar28) {
              lVar13 = *(long *)((long)pvVar19 + 0x18);
              lVar26 = local_148 + (long)iVar6 * 8;
              lVar16 = 0;
              do {
                iVar6 = *(int *)(((long)(int)uVar5 + 1) * 4 + lVar13 + lVar16 * 4);
                fVar29 = *(float *)(lVar26 + -4 + lVar16 * 8);
                fVar1 = *(float *)(lVar26 + lVar16 * 8);
                fVar30 = x[lVar12].r * fVar29 - fVar1 * x[lVar12].i;
                fVar29 = x[lVar12].i * fVar29 + x[lVar12].r * fVar1;
                fVar1 = x[iVar6].i;
                x[iVar6].r = x[iVar6].r - fVar30;
                x[iVar6].i = fVar1 - fVar29;
                lVar16 = lVar16 + 1;
              } while (~uVar5 + iVar28 != (int)lVar16);
            }
          }
          else {
            local_158 = (void *)CONCAT44(local_158._4_4_,fVar30);
            local_160 = (char *)CONCAT44(local_160._4_4_,fVar29);
            local_180 = (SuperMatrix *)CONCAT44(local_180._4_4_,fVar31);
            local_140 = x + lVar12;
            local_178 = pSVar17;
            clsolve(nsupr,iVar27,(singlecomplex *)((long)iVar6 * 8 + lVar9),local_140);
            psVar18 = local_150;
            cmatvec(nsupr,nsupr - nsupc,nsupc,(singlecomplex *)((long)(nsupc + iVar6) * 8 + lVar9),
                    local_140,local_150);
            pSVar17 = local_178;
            pvVar19 = local_170;
            fVar29 = local_160._0_4_;
            fVar30 = local_158._0_4_;
            fVar31 = local_180._0_4_;
            if (0 < (int)uVar25) {
              lVar26 = *(long *)((long)local_170 + 0x18);
              uVar14 = 0;
              do {
                iVar6 = *(int *)((long)(int)(uVar5 + nsupc) * 4 + lVar26 + uVar14 * 4);
                fVar1 = x[iVar6].i;
                x[iVar6].r = x[iVar6].r - psVar18[uVar14].r;
                x[iVar6].i = fVar1 - psVar18[uVar14].i;
                psVar18[uVar14].r = local_158._0_4_;
                psVar18[uVar14].i = local_160._0_4_;
                uVar14 = uVar14 + 1;
              } while (uVar14 < uVar25);
            }
          }
          fVar31 = fVar31 + (float)((iVar27 * 4 + 6) * iVar27) + (float)(int)(uVar25 * iVar27 * 8);
          bVar11 = (long)pSVar17 < (long)*(int *)((long)pvVar19 + 4);
          pSVar17 = (SuperMatrix *)((long)&pSVar17->Stype + 1);
        } while (bVar11);
        goto LAB_001124ef;
      }
    }
    else {
      if (local_180->nrow == 0) {
        return 0;
      }
      pSVar17 = (SuperMatrix *)(long)*(int *)((long)local_170 + 4);
      if (-1 < (long)pSVar17) {
        fVar31 = 0.0;
        pvVar20 = local_170;
        local_158 = pvVar19;
        do {
          iVar27 = *(int *)(*(long *)((long)pvVar20 + 0x30) + (long)pSVar17 * 4);
          lVar12 = (long)iVar27;
          nsupr = *(int *)(*(long *)((long)pvVar20 + 0x20) + 4 + lVar12 * 4) -
                  *(int *)(*(long *)((long)pvVar20 + 0x20) + lVar12 * 4);
          nsupc = *(int *)(*(long *)((long)pvVar20 + 0x30) + 4 + (long)pSVar17 * 4) - iVar27;
          local_180 = (SuperMatrix *)
                      CONCAT44(local_180._4_4_,(float)((nsupc * 4 + 0xe) * nsupc) + fVar31);
          psVar18 = x + lVar12;
          psVar15 = (singlecomplex *)
                    ((long)*(int *)(*(long *)((long)pvVar20 + 0x10) + lVar12 * 4) * 8 + lVar9);
          if (nsupc == 1) {
            local_178 = pSVar17;
            c_div(psVar18,psVar18,psVar15);
            iVar27 = *(int *)(*(long *)((long)local_158 + 0x18) + lVar12 * 4);
            lVar13 = (long)iVar27;
            iVar6 = *(int *)(*(long *)((long)local_158 + 0x18) + 4 + lVar12 * 4);
            if (iVar27 < iVar6) {
              lVar12 = *(long *)((long)local_158 + 0x10);
              do {
                iVar27 = *(int *)(lVar12 + lVar13 * 4);
                fVar31 = psVar18->r;
                fVar29 = psVar18->i;
                fVar30 = *(float *)(lVar26 + lVar13 * 8);
                fVar1 = *(float *)(lVar26 + 4 + lVar13 * 8);
                fVar2 = x[iVar27].i;
                x[iVar27].r = x[iVar27].r - (fVar31 * fVar30 - fVar1 * fVar29);
                x[iVar27].i = fVar2 - (fVar29 * fVar30 + fVar31 * fVar1);
                lVar13 = lVar13 + 1;
              } while (iVar6 != lVar13);
            }
            pvVar20 = local_170;
            pSVar22 = local_178;
            fVar31 = local_180._0_4_;
          }
          else {
            cusolve(nsupr,nsupc,psVar15,psVar18);
            iVar6 = *(int *)(*(long *)((long)pvVar20 + 0x30) + 4 + (long)pSVar17 * 4);
            pSVar22 = pSVar17;
            fVar31 = local_180._0_4_;
            if (iVar27 < iVar6) {
              lVar13 = *(long *)((long)local_158 + 0x18);
              do {
                iVar27 = *(int *)(lVar13 + 4 + lVar12 * 4);
                iVar28 = *(int *)(lVar13 + lVar12 * 4);
                lVar16 = (long)iVar28;
                if (iVar27 - iVar28 != 0 && iVar28 <= iVar27) {
                  lVar24 = *(long *)((long)local_158 + 0x10);
                  do {
                    iVar7 = *(int *)(lVar24 + lVar16 * 4);
                    fVar29 = x[lVar12].r;
                    fVar30 = x[lVar12].i;
                    fVar1 = *(float *)(lVar26 + lVar16 * 8);
                    fVar2 = *(float *)(lVar26 + 4 + lVar16 * 8);
                    fVar3 = x[iVar7].i;
                    x[iVar7].r = x[iVar7].r - (fVar29 * fVar1 - fVar2 * fVar30);
                    x[iVar7].i = fVar3 - (fVar30 * fVar1 + fVar29 * fVar2);
                    lVar16 = lVar16 + 1;
                  } while (iVar27 != lVar16);
                }
                lVar12 = lVar12 + 1;
                fVar31 = fVar31 + (float)((iVar27 - iVar28) * 8);
              } while (lVar12 != iVar6);
            }
          }
          pSVar17 = (SuperMatrix *)((long)&pSVar22[-1].Store + 7);
        } while (0 < (long)pSVar22);
        goto LAB_001124ef;
      }
    }
  }
  else if (cVar4 == 'L') {
    if (local_178->nrow == 0) {
      return 0;
    }
    local_160 = trans;
    if (-1 < (long)*(int *)((long)local_170 + 4)) {
      fVar31 = 0.0;
      lVar26 = (long)*(int *)((long)local_170 + 4);
      do {
        lVar12 = *(long *)((long)local_170 + 0x30);
        iVar27 = *(int *)(lVar12 + lVar26 * 4);
        lVar16 = (long)iVar27;
        iVar6 = *(int *)(*(long *)((long)local_170 + 0x20) + lVar16 * 4);
        nsupr = *(int *)(*(long *)((long)local_170 + 0x20) + 4 + lVar16 * 4) - iVar6;
        nsupc = *(int *)(lVar12 + 4 + lVar26 * 4) - iVar27;
        lVar13 = *(long *)((long)local_170 + 0x10);
        local_178 = (SuperMatrix *)(long)*(int *)(lVar13 + lVar16 * 4);
        iVar28 = *(int *)(lVar12 + 4 + lVar26 * 4);
        if (iVar27 < iVar28) {
          lVar12 = lVar16;
          do {
            lVar24 = (long)*(int *)(lVar13 + lVar12 * 4) + (long)nsupc;
            iVar27 = *(int *)(lVar13 + 4 + lVar12 * 4);
            if ((int)lVar24 < iVar27) {
              fVar29 = x[lVar12].r;
              fVar30 = x[lVar12].i;
              piVar23 = (int *)(*(long *)((long)local_170 + 0x18) + (long)(iVar6 + nsupc) * 4);
              do {
                temp.r = *(float *)(lVar9 + lVar24 * 8);
                fVar1 = *(float *)(lVar9 + 4 + lVar24 * 8);
                temp.i = -fVar1;
                fVar29 = fVar29 - (x[*piVar23].r * temp.r + fVar1 * x[*piVar23].i);
                fVar30 = fVar30 - (x[*piVar23].i * temp.r - x[*piVar23].r * fVar1);
                x[lVar12].r = fVar29;
                x[lVar12].i = fVar30;
                lVar24 = lVar24 + 1;
                piVar23 = piVar23 + 1;
              } while (lVar24 < iVar27);
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 != iVar28);
        }
        fVar31 = fVar31 + (float)((nsupr - nsupc) * nsupc * 8);
        if (1 < nsupc) {
          local_180 = (SuperMatrix *)
                      CONCAT44(local_180._4_4_,fVar31 + (float)((nsupc + -1) * nsupc * 4));
          ctrsv_("L",local_160,"U",&nsupc,(singlecomplex *)(lVar9 + (long)local_178 * 8),&nsupr,
                 x + lVar16,&incx);
          fVar31 = local_180._0_4_;
        }
        bVar11 = 0 < lVar26;
        lVar26 = lVar26 + -1;
      } while (bVar11);
      goto LAB_001124ef;
    }
  }
  else {
    if (local_180->nrow == 0) {
      return 0;
    }
    if (-1 < *(int *)((long)local_170 + 4)) {
      fVar31 = 0.0;
      lVar12 = 0;
      local_160 = trans;
      do {
        lVar13 = *(long *)((long)local_170 + 0x30);
        iVar27 = *(int *)(lVar13 + lVar12 * 4);
        lVar16 = (long)iVar27;
        nsupr = *(int *)(*(long *)((long)local_170 + 0x20) + 4 + lVar16 * 4) -
                *(int *)(*(long *)((long)local_170 + 0x20) + lVar16 * 4);
        iVar28 = *(int *)(lVar13 + 4 + lVar12 * 4) - iVar27;
        local_178 = (SuperMatrix *)(long)*(int *)(*(long *)((long)local_170 + 0x10) + lVar16 * 4);
        iVar6 = *(int *)(lVar13 + 4 + lVar12 * 4);
        if (iVar27 < iVar6) {
          lVar13 = *(long *)((long)pvVar19 + 0x18);
          lVar24 = lVar16;
          do {
            iVar27 = *(int *)(lVar13 + 4 + lVar24 * 4);
            iVar7 = *(int *)(lVar13 + lVar24 * 4);
            lVar21 = (long)iVar7;
            if (iVar27 - iVar7 != 0 && iVar7 <= iVar27) {
              lVar10 = *(long *)((long)pvVar19 + 0x10);
              fVar29 = x[lVar24].r;
              fVar30 = x[lVar24].i;
              do {
                iVar8 = *(int *)(lVar10 + lVar21 * 4);
                temp.r = *(float *)(lVar26 + lVar21 * 8);
                fVar1 = *(float *)(lVar26 + 4 + lVar21 * 8);
                temp.i = -fVar1;
                fVar29 = fVar29 - (x[iVar8].r * temp.r + fVar1 * x[iVar8].i);
                fVar30 = fVar30 - (x[iVar8].i * temp.r - x[iVar8].r * fVar1);
                x[lVar24].r = fVar29;
                x[lVar24].i = fVar30;
                lVar21 = lVar21 + 1;
              } while (iVar27 != lVar21);
            }
            lVar24 = lVar24 + 1;
            fVar31 = fVar31 + (float)((iVar27 - iVar7) * 8);
          } while (lVar24 != iVar6);
        }
        local_180 = (SuperMatrix *)CONCAT44(local_180._4_4_,fVar31);
        psVar18 = (singlecomplex *)((long)local_178 * 8 + lVar9);
        nsupc = iVar28;
        if (iVar28 == 1) {
          temp.r = psVar18->r;
          temp.i = -psVar18->i;
          c_div(x + lVar16,x + lVar16,&temp);
        }
        else {
          ctrsv_("U",local_160,"N",&nsupc,psVar18,&nsupr,x + lVar16,&incx);
        }
        fVar31 = local_180._0_4_ + (float)((iVar28 * 4 + 0xe) * iVar28);
        bVar11 = lVar12 < *(int *)((long)local_170 + 4);
        lVar12 = lVar12 + 1;
      } while (bVar11);
      goto LAB_001124ef;
    }
  }
  fVar31 = 0.0;
LAB_001124ef:
  stat->ops[0x11] = fVar31 + stat->ops[0x11];
  superlu_free(local_150);
  return 0;
}

Assistant:

int
sp_ctrsv(char *uplo, char *trans, char *diag, SuperMatrix *L, 
         SuperMatrix *U, singlecomplex *x, SuperLUStat_t *stat, int *info)
{
#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
	 ftcs2 = _cptofcd("N", strlen("N")),
	 ftcs3 = _cptofcd("U", strlen("U"));
#endif
    SCformat *Lstore;
    NCformat *Ustore;
    singlecomplex   *Lval, *Uval;
    int incx = 1, incy = 1;
    singlecomplex temp;
    singlecomplex alpha = {1.0, 0.0}, beta = {1.0, 0.0};
    singlecomplex comp_zero = {0.0, 0.0};
    int nrow, irow, jcol;
    int fsupc, nsupr, nsupc;
    int_t luptr, istart, i, k, iptr;
    singlecomplex *work;
    flops_t solve_ops;

    /* Test the input parameters */
    *info = 0;
    if ( strncmp(uplo,"L", 1)!=0 && strncmp(uplo, "U", 1)!=0 ) *info = -1;
    else if ( strncmp(trans, "N", 1)!=0 && strncmp(trans, "T", 1)!=0 && 
              strncmp(trans, "C", 1)!=0) *info = -2;
    else if ( strncmp(diag, "U", 1)!=0 && strncmp(diag, "N", 1)!=0 )
         *info = -3;
    else if ( L->nrow != L->ncol || L->nrow < 0 ) *info = -4;
    else if ( U->nrow != U->ncol || U->nrow < 0 ) *info = -5;
    if ( *info ) {
	int ii = -(*info);
	input_error("sp_ctrsv", &ii);
	return 0;
    }

    Lstore = L->Store;
    Lval = Lstore->nzval;
    Ustore = U->Store;
    Uval = Ustore->nzval;
    solve_ops = 0;

    if ( !(work = singlecomplexCalloc(L->nrow)) )
	ABORT("Malloc fails for work in sp_ctrsv().");
    
    if ( strncmp(trans, "N", 1)==0 ) {	/* Form x := inv(A)*x. */
	
	if ( strncmp(uplo, "L", 1)==0 ) {
	    /* Form x := inv(L)*x */
    	    if ( L->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = 0; k <= Lstore->nsuper; k++) {
		fsupc = L_FST_SUPC(k);
		istart = L_SUB_START(fsupc);
		nsupr = L_SUB_START(fsupc+1) - istart;
		nsupc = L_FST_SUPC(k+1) - fsupc;
		luptr = L_NZ_START(fsupc);
		nrow = nsupr - nsupc;

                /* 1 c_div costs 10 flops */
	        solve_ops += 4 * nsupc * (nsupc - 1) + 10 * nsupc;
	        solve_ops += 8 * nrow * nsupc;

		if ( nsupc == 1 ) {
		    for (iptr=istart+1; iptr < L_SUB_START(fsupc+1); ++iptr) {
			irow = L_SUB(iptr);
			++luptr;
			cc_mult(&comp_zero, &x[fsupc], &Lval[luptr]);
			c_sub(&x[irow], &x[irow], &comp_zero);
		    }
		} else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    CTRSV(ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
		       	&x[fsupc], &incx);
		
		    CGEMV(ftcs2, &nrow, &nsupc, &alpha, &Lval[luptr+nsupc], 
		       	&nsupr, &x[fsupc], &incx, &beta, &work[0], &incy);
#else
		    ctrsv_("L", "N", "U", &nsupc, &Lval[luptr], &nsupr,
		       	&x[fsupc], &incx);
		
		    cgemv_("N", &nrow, &nsupc, &alpha, &Lval[luptr+nsupc], 
		       	&nsupr, &x[fsupc], &incx, &beta, &work[0], &incy);
#endif
#else
		    clsolve ( nsupr, nsupc, &Lval[luptr], &x[fsupc]);
		
		    cmatvec ( nsupr, nsupr-nsupc, nsupc, &Lval[luptr+nsupc],
                             &x[fsupc], &work[0] );
#endif		
		
		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; ++i, ++iptr) {
			irow = L_SUB(iptr);
			c_sub(&x[irow], &x[irow], &work[i]); /* Scatter */
			work[i] = comp_zero;

		    }
	 	}
	    } /* for k ... */
	    
	} else {
	    /* Form x := inv(U)*x */
	    
	    if ( U->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = Lstore->nsuper; k >= 0; k--) {
	    	fsupc = L_FST_SUPC(k);
	    	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);
		
                /* 1 c_div costs 10 flops */
    	        solve_ops += 4 * nsupc * (nsupc + 1) + 10 * nsupc;

		if ( nsupc == 1 ) {
		    c_div(&x[fsupc], &x[fsupc], &Lval[luptr]);
		    for (i = U_NZ_START(fsupc); i < U_NZ_START(fsupc+1); ++i) {
			irow = U_SUB(i);
			cc_mult(&comp_zero, &x[fsupc], &Uval[i]);
			c_sub(&x[irow], &x[irow], &comp_zero);
		    }
		} else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    CTRSV(ftcs3, ftcs2, ftcs2, &nsupc, &Lval[luptr], &nsupr,
		       &x[fsupc], &incx);
#else
		    ctrsv_("U", "N", "N", &nsupc, &Lval[luptr], &nsupr,
                           &x[fsupc], &incx);
#endif
#else		
		    cusolve ( nsupr, nsupc, &Lval[luptr], &x[fsupc] );
#endif		

		    for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		        solve_ops += 8*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    	for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); 
				i++) {
			    irow = U_SUB(i);
			cc_mult(&comp_zero, &x[jcol], &Uval[i]);
			c_sub(&x[irow], &x[irow], &comp_zero);
		    	}
                    }
		}
	    } /* for k ... */
	    
	}
    } else if ( strncmp(trans, "T", 1)==0 ) { /* Form x := inv(A')*x */
	
	if ( strncmp(uplo, "L", 1)==0 ) {
	    /* Form x := inv(L')*x */
    	    if ( L->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = Lstore->nsuper; k >= 0; --k) {
	    	fsupc = L_FST_SUPC(k);
	    	istart = L_SUB_START(fsupc);
	    	nsupr = L_SUB_START(fsupc+1) - istart;
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		solve_ops += 8 * (nsupr - nsupc) * nsupc;

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    iptr = istart + nsupc;
		    for (i = L_NZ_START(jcol) + nsupc; 
				i < L_NZ_START(jcol+1); i++) {
			irow = L_SUB(iptr);
			cc_mult(&comp_zero, &x[irow], &Lval[i]);
		    	c_sub(&x[jcol], &x[jcol], &comp_zero);
			iptr++;
		    }
		}
		
		if ( nsupc > 1 ) {
		    solve_ops += 4 * nsupc * (nsupc - 1);
#ifdef _CRAY
                    ftcs1 = _cptofcd("L", strlen("L"));
                    ftcs2 = _cptofcd("T", strlen("T"));
                    ftcs3 = _cptofcd("U", strlen("U"));
		    CTRSV(ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			&x[fsupc], &incx);
#else
		    ctrsv_("L", "T", "U", &nsupc, &Lval[luptr], &nsupr,
			&x[fsupc], &incx);
#endif
		}
	    }
	} else {
	    /* Form x := inv(U')*x */
	    if ( U->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = 0; k <= Lstore->nsuper; k++) {
	    	fsupc = L_FST_SUPC(k);
	    	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    solve_ops += 8*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); i++) {
			irow = U_SUB(i);
			cc_mult(&comp_zero, &x[irow], &Uval[i]);
		    	c_sub(&x[jcol], &x[jcol], &comp_zero);
		    }
		}

                /* 1 c_div costs 10 flops */
		solve_ops += 4 * nsupc * (nsupc + 1) + 10 * nsupc;

		if ( nsupc == 1 ) {
		    c_div(&x[fsupc], &x[fsupc], &Lval[luptr]);
		} else {
#ifdef _CRAY
                    ftcs1 = _cptofcd("U", strlen("U"));
                    ftcs2 = _cptofcd("T", strlen("T"));
                    ftcs3 = _cptofcd("N", strlen("N"));
		    CTRSV( ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			    &x[fsupc], &incx);
#else
		    ctrsv_("U", "T", "N", &nsupc, &Lval[luptr], &nsupr,
			    &x[fsupc], &incx);
#endif
		}
	    } /* for k ... */
	}
    } else { /* Form x := conj(inv(A'))*x */
	
	if ( strncmp(uplo, "L", 1)==0 ) {
	    /* Form x := conj(inv(L'))*x */
    	    if ( L->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = Lstore->nsuper; k >= 0; --k) {
	    	fsupc = L_FST_SUPC(k);
	    	istart = L_SUB_START(fsupc);
	    	nsupr = L_SUB_START(fsupc+1) - istart;
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		solve_ops += 8 * (nsupr - nsupc) * nsupc;

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    iptr = istart + nsupc;
		    for (i = L_NZ_START(jcol) + nsupc; 
				i < L_NZ_START(jcol+1); i++) {
			irow = L_SUB(iptr);
                        cc_conj(&temp, &Lval[i]);
			cc_mult(&comp_zero, &x[irow], &temp);
		    	c_sub(&x[jcol], &x[jcol], &comp_zero);
			iptr++;
		    }
 		}
 		
 		if ( nsupc > 1 ) {
		    solve_ops += 4 * nsupc * (nsupc - 1);
#ifdef _CRAY
                    ftcs1 = _cptofcd("L", strlen("L"));
                    ftcs2 = _cptofcd(trans, strlen("T"));
                    ftcs3 = _cptofcd("U", strlen("U"));
		    CTRSV(ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			&x[fsupc], &incx);
#else
                    ctrsv_("L", trans, "U", &nsupc, &Lval[luptr], &nsupr,
                           &x[fsupc], &incx);
#endif
		}
	    }
	} else {
	    /* Form x := conj(inv(U'))*x */
	    if ( U->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = 0; k <= Lstore->nsuper; k++) {
	    	fsupc = L_FST_SUPC(k);
	    	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    solve_ops += 8*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); i++) {
			irow = U_SUB(i);
                        cc_conj(&temp, &Uval[i]);
			cc_mult(&comp_zero, &x[irow], &temp);
		    	c_sub(&x[jcol], &x[jcol], &comp_zero);
		    }
		}

                /* 1 c_div costs 10 flops */
		solve_ops += 4 * nsupc * (nsupc + 1) + 10 * nsupc;
 
		if ( nsupc == 1 ) {
                    cc_conj(&temp, &Lval[luptr]);
		    c_div(&x[fsupc], &x[fsupc], &temp);
		} else {
#ifdef _CRAY
                    ftcs1 = _cptofcd("U", strlen("U"));
                    ftcs2 = _cptofcd(trans, strlen("T"));
                    ftcs3 = _cptofcd("N", strlen("N"));
		    CTRSV( ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			    &x[fsupc], &incx);
#else
                    ctrsv_("U", trans, "N", &nsupc, &Lval[luptr], &nsupr,
                               &x[fsupc], &incx);
#endif
  		}
  	    } /* for k ... */
  	}
    }

    stat->ops[SOLVE] += solve_ops;
    SUPERLU_FREE(work);
    return 0;
}